

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

void processILibs(string *config,cmTarget *headTarget,cmLinkItem *item,
                 vector<const_cmTarget_*,_std::allocator<const_cmTarget_*>_> *tgts,
                 set<const_cmTarget_*,_std::less<const_cmTarget_*>,_std::allocator<const_cmTarget_*>_>
                 *emitted)

{
  LinkInterfaceLibraries *pLVar1;
  pointer item_00;
  cmTarget **__v;
  pair<std::_Rb_tree_iterator<const_cmTarget_*>,_bool> pVar2;
  
  if (item->Target != (cmTarget *)0x0) {
    __v = &item->Target;
    pVar2 = std::
            _Rb_tree<cmTarget_const*,cmTarget_const*,std::_Identity<cmTarget_const*>,std::less<cmTarget_const*>,std::allocator<cmTarget_const*>>
            ::_M_insert_unique<cmTarget_const*const&>
                      ((_Rb_tree<cmTarget_const*,cmTarget_const*,std::_Identity<cmTarget_const*>,std::less<cmTarget_const*>,std::allocator<cmTarget_const*>>
                        *)emitted,__v);
    if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      std::vector<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>::push_back(tgts,__v);
      pLVar1 = cmTarget::GetLinkInterfaceLibraries(*__v,config,headTarget,true);
      if (pLVar1 != (LinkInterfaceLibraries *)0x0) {
        for (item_00 = (pLVar1->Libraries).
                       super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
                       super__Vector_impl_data._M_start;
            item_00 !=
            (pLVar1->Libraries).super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
            super__Vector_impl_data._M_finish; item_00 = item_00 + 1) {
          processILibs(config,headTarget,item_00,tgts,emitted);
        }
      }
    }
  }
  return;
}

Assistant:

void processILibs(const std::string& config,
                  cmTarget const* headTarget,
                  cmLinkItem const& item,
                  std::vector<cmTarget const*>& tgts,
                  std::set<cmTarget const*>& emitted)
{
  if (item.Target && emitted.insert(item.Target).second)
    {
    tgts.push_back(item.Target);
    if(cmTarget::LinkInterfaceLibraries const* iface =
       item.Target->GetLinkInterfaceLibraries(config, headTarget, true))
      {
      for(std::vector<cmLinkItem>::const_iterator
            it = iface->Libraries.begin();
          it != iface->Libraries.end(); ++it)
        {
        processILibs(config, headTarget, *it, tgts, emitted);
        }
      }
    }
}